

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::
allocCallbackFailMultipleObjectsTest<vkt::api::(anonymous_namespace)::ComputePipeline>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  deInt32 *pdVar1;
  ostringstream *poVar2;
  PlatformInterface *pPVar3;
  Handle<(vk::HandleType)18> object;
  char *pcVar4;
  Context *this;
  bool bVar5;
  int iVar6;
  ProgramBinary *__s;
  VkAllocationCallbacks *allocator;
  DeviceInterface *pDVar7;
  Move<vk::Handle<(vk::HandleType)18>_> *pMVar8;
  Checked<vk::Handle<(vk::HandleType)18>_> CVar9;
  ulong uVar10;
  long *plVar11;
  ProgramBinary *pPVar12;
  Parameters *extraout_RDX;
  char **value;
  qpTestLog *pqVar13;
  undefined1 *puVar14;
  long lVar15;
  vector<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
  pipelineInfos;
  vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
  scopedHandles;
  VkComputePipelineCreateInfo commonPipelineInfo;
  Environment objEnv;
  Resources res;
  DeterministicFailAllocator objAllocator;
  AllocationCallbackRecorder recorder;
  ulong local_368;
  SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_> local_358;
  VkDevice local_348;
  Context *local_340;
  vector<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
  local_338;
  size_t local_320;
  vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
  local_318;
  undefined1 local_2f8 [16];
  ProgramBinary local_2e8;
  VkShaderModule local_2c8;
  char *local_2c0;
  VkSpecializationInfo *local_2b8;
  VkPipelineLayout local_2b0;
  VkPipeline local_2a8;
  deInt32 local_2a0;
  Environment local_298;
  undefined1 local_260 [16];
  qpTestLog *local_250 [9];
  Handle<(vk::HandleType)16> local_208;
  ios_base local_1e8 [8];
  Handle<(vk::HandleType)15> local_1e0;
  DeterministicFailAllocator local_e0;
  AllocationCallbackRecorder local_90;
  
  __s = (ProgramBinary *)operator_new(0x20);
  pPVar12 = (ProgramBinary *)&__s->m_binary;
  if (&__s->m_binary < __s + 1) {
    pPVar12 = __s + 1;
  }
  local_320 = ((long)&pPVar12->m_format + ~(ulong)__s & 0xfffffffffffffff8) + 8;
  local_368 = 0;
  local_340 = context;
  while( true ) {
    this = local_340;
    memset(__s,0xde,local_320);
    allocator = ::vk::getSystemAllocator();
    ::vk::DeterministicFailAllocator::DeterministicFailAllocator
              (&local_e0,allocator,MODE_DO_NOT_COUNT,0);
    ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
              (&local_90,&local_e0.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks,0x80
              );
    pPVar3 = this->m_platformInterface;
    pDVar7 = Context::getDeviceInterface(this);
    local_348 = Context::getDevice(this);
    local_298.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(this);
    local_298.programBinaries = this->m_progCollection;
    local_298.device = local_348;
    local_298.allocationCallbacks =
         &local_90.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
    local_298.maxResourceConsumers = 4;
    local_260._0_8_ = this->m_testCtx->m_log;
    poVar2 = (ostringstream *)(local_260 + 8);
    local_298.vkp = pPVar3;
    local_298.vkd = pDVar7;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Trying to create ",0x11);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," objects with ",0xe);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," allocation",0xb);
    pcVar4 = ",\n\t\t";
    if (local_368 != 1) {
      pcVar4 = "%s<%s";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,pcVar4 + 4,(ulong)(local_368 != 1));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," passing",8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_1e8);
    ComputePipeline::Resources::Resources((Resources *)local_260,&local_298,extraout_RDX);
    ::vk::DeterministicFailAllocator::reset(&local_e0,MODE_COUNT_AND_FAIL,(deUint32)local_368);
    local_2f8._0_4_ = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
    local_2f8._8_8_ = (void *)0x0;
    local_2e8.m_format = 0;
    local_2e8.m_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
    local_2e8.m_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2e8.m_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x2000000000;
    local_2c8.m_internal = local_260._8_8_;
    local_2c0 = "main";
    local_2b8 = (VkSpecializationInfo *)0x0;
    local_2b0.m_internal = local_208.m_internal;
    local_2a8.m_internal = 0;
    local_2a0 = 0;
    std::vector<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>::
    vector(&local_338,4,(value_type *)local_2f8,(allocator_type *)&local_358);
    iVar6 = (*pDVar7->_vptr_DeviceInterface[0x31])
                      (pDVar7,local_348,local_1e0.m_internal,4,
                       local_338.
                       super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       &local_90.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks,__s);
    local_348 = (VkDevice)CONCAT44(local_348._4_4_,iVar6);
    local_318.
    super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_318.
    super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_318.
    super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar15 = 0;
    do {
      object.m_internal = *(deUint64 *)(&__s->m_format + lVar15 * 2);
      if (object.m_internal != 0) {
        pMVar8 = (Move<vk::Handle<(vk::HandleType)18>_> *)operator_new(0x20);
        CVar9 = ::vk::refdetails::check<vk::Handle<(vk::HandleType)18>>(object);
        (pMVar8->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal =
             (deUint64)CVar9.object.m_internal;
        (pMVar8->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_deviceIface =
             local_298.vkd;
        (pMVar8->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_device =
             local_298.device;
        (pMVar8->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_allocator =
             local_298.allocationCallbacks;
        local_358.m_state = (SharedPtrStateBase *)0x0;
        local_358.m_ptr = pMVar8;
        local_358.m_state = (SharedPtrStateBase *)operator_new(0x20);
        (local_358.m_state)->strongRefCount = 0;
        (local_358.m_state)->weakRefCount = 0;
        (local_358.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00ceeff0;
        local_358.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pMVar8;
        (local_358.m_state)->strongRefCount = 1;
        (local_358.m_state)->weakRefCount = 1;
        std::
        vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>>>>>
        ::emplace_back<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>>>>
                  ((vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>>>>>
                    *)&local_318,&local_358);
        if (local_358.m_state != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &(local_358.m_state)->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_358.m_ptr = (Move<vk::Handle<(vk::HandleType)18>_> *)0x0;
            (*(local_358.m_state)->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &(local_358.m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if ((*pdVar1 == 0) && (local_358.m_state != (SharedPtrStateBase *)0x0)) {
            (*(local_358.m_state)->_vptr_SharedPtrStateBase[1])();
          }
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 4);
    if (local_338.
        super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_338.
                      super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_338.
                            super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_338.
                            super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ::~vector(&local_318);
    ComputePipeline::Resources::~Resources((Resources *)local_260);
    if ((VkResult)local_348 == VK_SUCCESS) {
      local_260._0_8_ = local_340->m_testCtx->m_log;
      poVar2 = (ostringstream *)(local_260 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Construction of all objects succeeded! ",0x27);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_1e8);
      ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_90);
      ::vk::ChainedAllocator::~ChainedAllocator(&local_e0.super_ChainedAllocator);
      operator_delete(__s,0x20);
      if (local_368 != 0) goto LAB_003ff03e;
      local_260._0_8_ = local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_260,"Allocation callbacks not called","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_QUALITY_WARNING;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_260._0_8_,
                 (long)(ProgramFormat *)local_260._0_8_ + local_260._8_8_);
      goto LAB_003ff1b7;
    }
    uVar10 = local_368;
    if (local_368 < 4) {
      do {
        if (*(long *)(&__s->m_format + uVar10 * 2) != 0) {
          local_260._0_8_ = local_250;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_260,"Some object handles weren\'t set to NULL","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->m_description,local_260._0_8_,
                     (long)(ProgramFormat *)local_260._0_8_ + local_260._8_8_);
          goto LAB_003fef4e;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != 4);
    }
    if ((VkResult)local_348 != VK_ERROR_OUT_OF_HOST_MEMORY) break;
    bVar5 = ::vk::validateAndLog(local_340->m_testCtx->m_log,&local_90,0);
    if (!bVar5) {
      local_260._0_8_ = local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_260,"Invalid allocation callback","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_260._0_8_,
                 (long)(ProgramFormat *)local_260._0_8_ + local_260._8_8_);
LAB_003fef4e:
      pqVar13 = local_250[0];
      pPVar12 = (ProgramBinary *)local_260._0_8_;
      if ((ProgramBinary *)local_260._0_8_ != (ProgramBinary *)local_250) goto LAB_003fef63;
      goto LAB_003fef6b;
    }
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_90);
    ::vk::ChainedAllocator::~ChainedAllocator(&local_e0.super_ChainedAllocator);
    local_368 = local_368 + 1;
    if (local_368 == 5) {
      operator_delete(__s,0x20);
LAB_003ff03e:
      local_260._0_8_ = local_250;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"Ok","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_260._0_8_,
                 (long)(ProgramFormat *)local_260._0_8_ + local_260._8_8_);
LAB_003ff1b7:
      if ((ProgramBinary *)local_260._0_8_ != (ProgramBinary *)local_250) {
        puVar14 = (undefined1 *)((long)&local_250[0]->flags + 1);
        __s = (ProgramBinary *)local_260._0_8_;
LAB_003fef8d:
        operator_delete(__s,(ulong)puVar14);
      }
      return __return_storage_ptr__;
    }
  }
  local_338.
  super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)::vk::getResultName((VkResult)local_348);
  de::toString<char_const*>((string *)local_2f8,(de *)&local_338,value);
  plVar11 = (long *)std::__cxx11::string::replace((ulong)local_2f8,0,(char *)0x0,0xa9ec08);
  pPVar12 = (ProgramBinary *)(plVar11 + 2);
  if ((ProgramBinary *)*plVar11 == pPVar12) {
    local_250[0] = *(qpTestLog **)pPVar12;
    local_250[1]._0_4_ = *(undefined4 *)(plVar11 + 3);
    local_250[1]._4_4_ = *(undefined4 *)((long)plVar11 + 0x1c);
    local_260._0_8_ = (ProgramBinary *)local_250;
  }
  else {
    local_250[0] = *(qpTestLog **)pPVar12;
    local_260._0_8_ = (ProgramBinary *)*plVar11;
  }
  local_260._8_8_ = plVar11[1];
  *plVar11 = (long)pPVar12;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_260._0_8_,
             (long)&((ProgramBinary *)local_260._0_8_)->m_format + local_260._8_8_);
  if ((ProgramBinary *)local_260._0_8_ != (ProgramBinary *)local_250) {
    operator_delete((void *)local_260._0_8_,(ulong)((long)&local_250[0]->flags + 1));
  }
  if ((ProgramBinary *)CONCAT44(local_2f8._4_4_,local_2f8._0_4_) != &local_2e8) {
    pqVar13 = (qpTestLog *)CONCAT44(local_2e8._4_4_,local_2e8.m_format);
    pPVar12 = (ProgramBinary *)CONCAT44(local_2f8._4_4_,local_2f8._0_4_);
LAB_003fef63:
    operator_delete(pPVar12,(ulong)((long)&pqVar13->flags + 1));
  }
LAB_003fef6b:
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_90);
  ::vk::ChainedAllocator::~ChainedAllocator(&local_e0.super_ChainedAllocator);
  puVar14 = (undefined1 *)0x20;
  goto LAB_003fef8d;
}

Assistant:

tcu::TestStatus allocCallbackFailMultipleObjectsTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<Move<typename Object::Type> >	ObjectTypeSp;

	static const deUint32	numObjects			= 4;
	const bool				expectNullHandles	= isNullHandleOnAllocationFailure<typename Object::Type>(context);
	deUint32				numPassingAllocs	= 0;

	{
		vector<typename Object::Type>	handles	(numObjects);
		VkResult						result	= VK_NOT_READY;

		for (; numPassingAllocs <= numObjects; ++numPassingAllocs)
		{
			ValidateQueryBits::fillBits(handles.begin(), handles.end());	// fill with garbage

			// \note We have to use the same allocator for both resource dependencies and the object under test,
			//       because pooled objects take memory from the pool.
			DeterministicFailAllocator			objAllocator(getSystemAllocator(), DeterministicFailAllocator::MODE_DO_NOT_COUNT, 0);
			AllocationCallbackRecorder			recorder	(objAllocator.getCallbacks(), 128);
			const Environment					objEnv		(context.getPlatformInterface(),
															 context.getDeviceInterface(),
															 context.getDevice(),
															 context.getUniversalQueueFamilyIndex(),
															 context.getBinaryCollection(),
															 recorder.getCallbacks(),
															 numObjects);

			context.getTestContext().getLog()
				<< TestLog::Message
				<< "Trying to create " << numObjects << " objects with " << numPassingAllocs << " allocation" << (numPassingAllocs != 1 ? "s" : "") << " passing"
				<< TestLog::EndMessage;

			{
				const typename Object::Resources res (objEnv, params);

				objAllocator.reset(DeterministicFailAllocator::MODE_COUNT_AND_FAIL, numPassingAllocs);
				const vector<ObjectTypeSp> scopedHandles = Object::createMultiple(objEnv, res, params, &handles, &result);
			}

			if (result == VK_SUCCESS)
			{
				context.getTestContext().getLog() << TestLog::Message << "Construction of all objects succeeded! " << TestLog::EndMessage;
				break;
			}
			else
			{
				if (expectNullHandles)
				{
					for (deUint32 nullNdx = numPassingAllocs; nullNdx < numObjects; ++nullNdx)
					{
						if (handles[nullNdx] != DE_NULL)
							return tcu::TestStatus::fail("Some object handles weren't set to NULL");
					}
				}

				if (result != VK_ERROR_OUT_OF_HOST_MEMORY)
					return tcu::TestStatus::fail("Got invalid error code: " + de::toString(getResultName(result)));

				if (!validateAndLog(context.getTestContext().getLog(), recorder, 0u))
					return tcu::TestStatus::fail("Invalid allocation callback");
			}
		}
	}

	if (numPassingAllocs == 0)
	{
		if (isPooledObject<typename Object::Type>())
			return tcu::TestStatus::pass("Not validated: pooled objects didn't seem to use host memory");
		else
			return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Allocation callbacks not called");
	}
	else
		return tcu::TestStatus::pass("Ok");
}